

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPerm.c
# Opt level: O2

int Abc_ZddBuildSet(Abc_ZddMan *p,int *pSet,int Size)

{
  int iVar1;
  ulong uVar2;
  int True;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  
  True = 1;
  iVar3 = 1;
  if (1 < Size) {
    iVar3 = Size;
  }
  uVar9 = (ulong)(uint)Size;
  uVar4 = 1;
  for (uVar5 = 0; uVar5 != iVar3 - 1; uVar5 = uVar5 + 1) {
    uVar8 = uVar5 & 0xffffffff;
    for (uVar6 = uVar4; iVar7 = (int)uVar8, uVar9 != uVar6; uVar6 = uVar6 + 1) {
      uVar2 = uVar6 & 0xffffffff;
      if (pSet[iVar7] <= pSet[uVar6]) {
        uVar2 = uVar8;
      }
      uVar8 = uVar2;
    }
    iVar1 = pSet[uVar5];
    pSet[uVar5] = pSet[iVar7];
    pSet[iVar7] = iVar1;
    uVar4 = uVar4 + 1;
  }
  for (; 0 < (int)uVar9; uVar9 = uVar9 - 1) {
    True = Abc_ZddUniqueCreate(p,pSet[uVar9 - 1],True,0);
  }
  return True;
}

Assistant:

int Abc_ZddBuildSet( Abc_ZddMan * p, int * pSet, int Size )
{
    int i, Res = 1;
    Vec_IntSelectSort( pSet, Size );
    for ( i = Size - 1; i >= 0; i-- )
        Res = Abc_ZddUniqueCreate( p, pSet[i], Res, 0 );
    return Res;
}